

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnlabeledValueArg.h
# Opt level: O3

void __thiscall
TCLAP::
UnlabeledValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::UnlabeledValueArg(UnlabeledValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *this,string *name,string *desc,bool req,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *val,
                   string *typeDesc,CmdLineInterface *parser,bool ignoreable,Visitor *v)

{
  pointer pcVar1;
  SpecificationException *this_00;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"");
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  pcVar1 = (val->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar1,pcVar1 + val->_M_string_length);
  ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ValueArg(&this->
            super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ,&local_90,name,desc,req,&local_70,typeDesc,v);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  (this->
  super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>).
  super_Arg._vptr_Arg = (_func_int **)&PTR__ValueArg_00156b68;
  (this->
  super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>).
  super_Arg._ignoreable = ignoreable;
  Arg::toString_abi_cxx11_(&local_50,(Arg *)this);
  if (OptionalUnlabeledTracker::alreadyOptionalRef()::ct != '\x01') {
    if (!req) {
      OptionalUnlabeledTracker::alreadyOptionalRef()::ct = '\x01';
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    (*parser->_vptr_CmdLineInterface[3])(parser,this);
    return;
  }
  this_00 = (SpecificationException *)__cxa_allocate_exception(0x68);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,
             "You can\'t specify ANY Unlabeled Arg following an optional Unlabeled Arg","");
  SpecificationException::SpecificationException(this_00,&local_90,&local_50);
  __cxa_throw(this_00,&SpecificationException::typeinfo,ArgException::~ArgException);
}

Assistant:

UnlabeledValueArg<T>::UnlabeledValueArg(const std::string& name, 
					                    const std::string& desc, 
										bool req,
					                    T val,
					                    const std::string& typeDesc,
					                    CmdLineInterface& parser,
					                    bool ignoreable,
					                    Visitor* v)
: ValueArg<T>("", name, desc, req, val, typeDesc, v)
{ 
	_ignoreable = ignoreable;
	OptionalUnlabeledTracker::check(req, toString());
	parser.add( this );
}